

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

void __thiscall xe::TestResultParser::handleElementEnd(TestResultParser *this)

{
  Item *pIVar1;
  Type TVar2;
  deBool dVar3;
  Type TVar4;
  TestResultParseError *pTVar5;
  NumericValue NVar6;
  undefined4 uStack_13c;
  SampleValue *value;
  Number *number;
  Result *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Item *local_a0;
  Item *curItem;
  undefined1 local_8d;
  Type itemType;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *elemName;
  TestResultParser *this_local;
  
  elemName = (char *)this;
  local_18 = xml::Parser::getElementName(&this->m_xmlParser);
  if (this->m_state != STATE_IN_TEST_CASE_RESULT) {
    local_8d = 1;
    pTVar5 = (TestResultParseError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Unexpected </",&local_79);
    std::operator+(&local_58,&local_78,local_18);
    std::operator+(&local_38,&local_58,"> outside of <TestCaseResult>");
    TestResultParseError::TestResultParseError(pTVar5,&local_38);
    local_8d = 0;
    __cxa_throw(pTVar5,&TestResultParseError::typeinfo,TestResultParseError::~TestResultParseError);
  }
  dVar3 = deStringEqual(local_18,"TestCaseResult");
  if (dVar3 == 0) {
    curItem._4_4_ = getResultItemType(local_18);
    local_a0 = getCurrentItem(this);
    TVar2 = curItem._4_4_;
    if ((local_a0 == (Item *)0x0) ||
       (TVar4 = ri::Item::getType(local_a0), pIVar1 = local_a0, TVar2 != TVar4)) {
      result._6_1_ = 1;
      pTVar5 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"Unexpected </",(allocator<char> *)((long)&result + 7));
      std::operator+(&local_e0,&local_100,local_18);
      std::operator+(&local_c0,&local_e0,">");
      TestResultParseError::TestResultParseError(pTVar5,&local_c0);
      result._6_1_ = 0;
      __cxa_throw(pTVar5,&TestResultParseError::typeinfo,TestResultParseError::~TestResultParseError
                 );
    }
    if (curItem._4_4_ == TYPE_RESULT) {
      (this->m_result->super_TestCaseResultHeader).statusCode =
           *(TestStatusCode *)&local_a0->field_0xc;
      std::__cxx11::string::operator=
                ((string *)&(this->m_result->super_TestCaseResultHeader).statusDetails,
                 (string *)(local_a0 + 1));
    }
    else if (curItem._4_4_ == TYPE_NUMBER) {
      NVar6 = getNumericValue(&this->m_curNumValue);
      pIVar1[9]._vptr_Item = (_func_int **)CONCAT44(value._4_4_,NVar6.m_type);
      *(anon_union_8_2_07d0b834_for_m_value *)&pIVar1[9].m_type = (deInt64)NVar6.m_value;
      std::__cxx11::string::clear();
    }
    else if (curItem._4_4_ == TYPE_SAMPLEVALUE) {
      NVar6 = getNumericValue(&this->m_curNumValue);
      pIVar1[1]._vptr_Item = (_func_int **)CONCAT44(uStack_13c,NVar6.m_type);
      *(anon_union_8_2_07d0b834_for_m_value *)&pIVar1[1].m_type = (deInt64)NVar6.m_value;
      std::__cxx11::string::clear();
    }
    popItem(this);
  }
  else {
    this->m_state = STATE_TEST_CASE_RESULT_ENDED;
  }
  return;
}

Assistant:

void TestResultParser::handleElementEnd (void)
{
	const char* elemName = m_xmlParser.getElementName();

	if (m_state != STATE_IN_TEST_CASE_RESULT)
		throw TestResultParseError(string("Unexpected </") + elemName + "> outside of <TestCaseResult>");

	if (deStringEqual(elemName, "TestCaseResult"))
	{
		// Logs from buggy test cases may contain invalid XML.
		// DE_ASSERT(getCurrentItem() == DE_NULL);
		// \todo [2012-11-22 pyry] Log warning.

		m_state = STATE_TEST_CASE_RESULT_ENDED;
	}
	else
	{
		ri::Type	itemType	= getResultItemType(elemName);
		ri::Item*	curItem		= getCurrentItem();

		if (!curItem || itemType != curItem->getType())
			throw TestResultParseError(string("Unexpected </") + elemName + ">");

		if (itemType == ri::TYPE_RESULT)
		{
			ri::Result* result = static_cast<ri::Result*>(curItem);
			m_result->statusCode	= result->statusCode;
			m_result->statusDetails	= result->details;
		}
		else if (itemType == ri::TYPE_NUMBER)
		{
			// Parse value for number.
			ri::Number*	number	= static_cast<ri::Number*>(curItem);
			number->value = getNumericValue(m_curNumValue);
			m_curNumValue.clear();
		}
		else if (itemType == ri::TYPE_SAMPLEVALUE)
		{
			ri::SampleValue* value = static_cast<ri::SampleValue*>(curItem);
			value->value = getNumericValue(m_curNumValue);
			m_curNumValue.clear();
		}

		popItem();
	}
}